

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.h
# Opt level: O2

void __thiscall
chrono::ChPhysicsItem::IntStateIncrement
          (ChPhysicsItem *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  double dVar1;
  double dVar2;
  int iVar3;
  CoeffReturnType pdVar4;
  Scalar *pSVar5;
  ulong index;
  long lVar6;
  
  lVar6 = 0;
  while( true ) {
    iVar3 = (**(code **)(*(long *)this + 0xb0))(this);
    if (iVar3 <= lVar6) break;
    index = (ulong)(off_x + (int)lVar6);
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,index);
    dVar1 = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)Dv,
                        (ulong)(off_v + (int)lVar6));
    dVar2 = *pdVar4;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x_new,index);
    lVar6 = lVar6 + 1;
    *pSVar5 = dVar1 + dVar2;
  }
  return;
}

Assistant:

virtual void IntStateIncrement(const unsigned int off_x,  ///< offset in x state vector
                                   ChState& x_new,            ///< state vector, position part, incremented result
                                   const ChState& x,          ///< state vector, initial position part
                                   const unsigned int off_v,  ///< offset in v state vector
                                   const ChStateDelta& Dv     ///< state vector, increment
    ) {
        for (int i = 0; i < GetDOF(); ++i) {
            x_new(off_x + i) = x(off_x + i) + Dv(off_v + i);
        }
    }